

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O2

void start_input_gif(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  int *piVar1;
  jpeg_error_mgr *pjVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  JSAMPARRAY ppJVar6;
  void *pvVar7;
  _func_void_j_compress_ptr_cjpeg_source_ptr *p_Var8;
  _func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *p_Var9;
  jvirt_sarray_ptr pjVar10;
  code *pcVar11;
  ulong uVar12;
  cd_progress_ptr progress;
  uint uVar13;
  uint uVar14;
  U_CHAR hdrbuf [10];
  uint local_34;
  
  sVar5 = fread(hdrbuf,1,6,(FILE *)sinfo->input_file);
  if (sVar5 != 6) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3fb;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if (((hdrbuf[0] != 'G') || (hdrbuf[1] != 'I')) || (hdrbuf[2] != 'F')) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3fb;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((hdrbuf[5] != 'a' || (hdrbuf[4] != '7' || hdrbuf[3] != '8')) &&
     (((hdrbuf[3] != '8' || (hdrbuf[4] != '9')) || (hdrbuf[5] != 'a')))) {
    pjVar2 = cinfo->err;
    *(uint *)&pjVar2->msg_parm = (uint)hdrbuf[3];
    *(uint *)((long)&pjVar2->msg_parm + 4) = (uint)hdrbuf[4];
    *(uint *)((long)&pjVar2->msg_parm + 8) = (uint)hdrbuf[5];
    pjVar2->msg_code = 0x3fd;
    (*pjVar2->emit_message)((j_common_ptr)cinfo,1);
  }
  sVar5 = fread(hdrbuf,1,7,(FILE *)sinfo->input_file);
  if (sVar5 != 7) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x2b;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((hdrbuf._0_2_ == 0) || (hdrbuf._2_2_ == 0)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3f9;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((hdrbuf[6] != '\0') && (hdrbuf[6] != '1')) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3ff;
    (*pjVar2->emit_message)((j_common_ptr)cinfo,1);
  }
  ppJVar6 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,0x100,3);
  sinfo[1].get_pixel_rows = (_func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *)ppJVar6;
  local_34 = 0;
  if ((char)hdrbuf[4] < '\0') {
    local_34 = 2 << (hdrbuf[4] & 7);
    ReadColorMap((gif_source_ptr)sinfo,local_34,ppJVar6);
  }
  do {
    while (iVar4 = ReadByte((gif_source_ptr)sinfo), iVar4 == 0x21) {
      iVar4 = ReadByte((gif_source_ptr)sinfo);
      lVar3 = *(long *)sinfo[1].start_input;
      *(undefined4 *)(lVar3 + 0x28) = 0x3fe;
      *(int *)(lVar3 + 0x2c) = iVar4;
      (**(code **)(*(long *)sinfo[1].start_input + 8))(sinfo[1].start_input,1);
      SkipDataBlocks((gif_source_ptr)sinfo);
    }
    if (iVar4 == 0x3b) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3fa;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    else if (iVar4 == 0x2c) {
      sVar5 = fread(hdrbuf,1,9,(FILE *)sinfo->input_file);
      if (sVar5 != 9) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x2b;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
      if ((hdrbuf._4_2_ == 0) || (hdrbuf._6_2_ == 0)) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x3f9;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
      *(uint *)&sinfo[8].input_file = hdrbuf[8] >> 6 & 1;
      if ((char)hdrbuf[8] < '\0') {
        local_34 = 2 << (hdrbuf[8] & 7);
        ReadColorMap((gif_source_ptr)sinfo,local_34,(JSAMPARRAY)sinfo[1].get_pixel_rows);
      }
      iVar4 = ReadByte((gif_source_ptr)sinfo);
      *(int *)&sinfo[7].get_pixel_rows = iVar4;
      if (iVar4 - 9U < 0xfffffff9) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x3f7;
        (pjVar2->msg_parm).i[0] = iVar4;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      pvVar7 = (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x2000);
      *(void **)&sinfo[7].buffer_height = pvVar7;
      p_Var8 = (_func_void_j_compress_ptr_cjpeg_source_ptr *)
               (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x1000);
      sinfo[8].start_input = p_Var8;
      p_Var9 = (_func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *)
               (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x1000);
      sinfo[8].get_pixel_rows = p_Var9;
      *(undefined4 *)((long)&sinfo[6].buffer + 4) = 2;
      *(undefined2 *)&sinfo[1].finish_input = 0;
      *(undefined8 *)&sinfo[6].buffer_height = 0;
      sinfo[7].start_input = (_func_void_j_compress_ptr_cjpeg_source_ptr *)0x1;
      iVar4 = 1 << (*(byte *)&sinfo[7].get_pixel_rows & 0x1f);
      *(int *)((long)&sinfo[7].get_pixel_rows + 4) = iVar4;
      *(int *)&sinfo[7].finish_input = iVar4 + 1;
      ReInitLZW((gif_source_ptr)sinfo);
      uVar14 = (uint)(ushort)hdrbuf._4_2_;
      uVar13 = (uint)(ushort)hdrbuf._6_2_;
      if (*(int *)&sinfo[8].input_file == 0) {
        pcVar11 = get_pixel_rows;
      }
      else {
        pjVar10 = (*cinfo->mem->request_virt_sarray)((j_common_ptr)cinfo,1,0,uVar14,uVar13,1);
        sinfo[8].buffer = (JSAMPARRAY)pjVar10;
        pcVar11 = load_interlaced_image;
        if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
          piVar1 = (int *)((long)&cinfo->progress[1].progress_monitor + 4);
          *piVar1 = *piVar1 + 1;
        }
      }
      sinfo->get_pixel_rows = pcVar11;
      ppJVar6 = (*cinfo->mem->alloc_sarray)
                          ((j_common_ptr)cinfo,1,
                           (uint)(ushort)hdrbuf._4_2_ + (uint)(ushort)hdrbuf._4_2_ * 2,1);
      sinfo->buffer = ppJVar6;
      sinfo->buffer_height = 1;
      for (uVar12 = (ulong)local_34;
          (long)uVar12 < (long)*(int *)((long)&sinfo[7].get_pixel_rows + 4); uVar12 = uVar12 + 1) {
        *(undefined1 *)(*(long *)(sinfo[1].get_pixel_rows + 0x10) + uVar12) = 0x80;
        *(undefined1 *)(*(long *)(sinfo[1].get_pixel_rows + 8) + uVar12) = 0x80;
        *(undefined1 *)(*(long *)sinfo[1].get_pixel_rows + uVar12) = 0x80;
      }
      cinfo->input_components = 3;
      cinfo->in_color_space = JCS_RGB;
      cinfo->data_precision = 8;
      cinfo->image_width = uVar14;
      cinfo->image_height = uVar13;
      pjVar2 = cinfo->err;
      *(uint *)&pjVar2->msg_parm = uVar14;
      *(uint *)((long)&pjVar2->msg_parm + 4) = uVar13;
      (pjVar2->msg_parm).i[2] = local_34;
      pjVar2->msg_code = 0x3fc;
      (*pjVar2->emit_message)((j_common_ptr)cinfo,1);
      return;
    }
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x401;
    (pjVar2->msg_parm).i[0] = iVar4;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
  } while( true );
}

Assistant:

METHODDEF(void)
start_input_gif(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  gif_source_ptr source = (gif_source_ptr)sinfo;
  U_CHAR hdrbuf[10];            /* workspace for reading control blocks */
  unsigned int width, height;   /* image dimensions */
  int colormaplen, aspectRatio;
  int c;

  /* Read and verify GIF Header */
  if (!ReadOK(source->pub.input_file, hdrbuf, 6))
    ERREXIT(cinfo, JERR_GIF_NOT);
  if (hdrbuf[0] != 'G' || hdrbuf[1] != 'I' || hdrbuf[2] != 'F')
    ERREXIT(cinfo, JERR_GIF_NOT);
  /* Check for expected version numbers.
   * If unknown version, give warning and try to process anyway;
   * this is per recommendation in GIF89a standard.
   */
  if ((hdrbuf[3] != '8' || hdrbuf[4] != '7' || hdrbuf[5] != 'a') &&
      (hdrbuf[3] != '8' || hdrbuf[4] != '9' || hdrbuf[5] != 'a'))
    TRACEMS3(cinfo, 1, JTRC_GIF_BADVERSION, hdrbuf[3], hdrbuf[4], hdrbuf[5]);

  /* Read and decipher Logical Screen Descriptor */
  if (!ReadOK(source->pub.input_file, hdrbuf, 7))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  width = LM_to_uint(hdrbuf, 0);
  height = LM_to_uint(hdrbuf, 2);
  if (width == 0 || height == 0)
    ERREXIT(cinfo, JERR_GIF_EMPTY);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (sinfo->max_pixels &&
      (unsigned long long)width * height > sinfo->max_pixels)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif
  /* we ignore the color resolution, sort flag, and background color index */
  aspectRatio = UCH(hdrbuf[6]);
  if (aspectRatio != 0 && aspectRatio != 49)
    TRACEMS(cinfo, 1, JTRC_GIF_NONSQUARE);

  /* Allocate space to store the colormap */
  source->colormap = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)MAXCOLORMAPSIZE,
     (JDIMENSION)NUMCOLORS);
  colormaplen = 0;              /* indicate initialization */

  /* Read global colormap if header indicates it is present */
  if (BitSet(hdrbuf[4], COLORMAPFLAG)) {
    colormaplen = 2 << (hdrbuf[4] & 0x07);
    ReadColorMap(source, colormaplen, source->colormap);
  }

  /* Scan until we reach start of desired image.
   * We don't currently support skipping images, but could add it easily.
   */
  for (;;) {
    c = ReadByte(source);

    if (c == ';')               /* GIF terminator?? */
      ERREXIT(cinfo, JERR_GIF_IMAGENOTFOUND);

    if (c == '!') {             /* Extension */
      DoExtension(source);
      continue;
    }

    if (c != ',') {             /* Not an image separator? */
      WARNMS1(cinfo, JWRN_GIF_CHAR, c);
      continue;
    }

    /* Read and decipher Local Image Descriptor */
    if (!ReadOK(source->pub.input_file, hdrbuf, 9))
      ERREXIT(cinfo, JERR_INPUT_EOF);
    /* we ignore top/left position info, also sort flag */
    width = LM_to_uint(hdrbuf, 4);
    height = LM_to_uint(hdrbuf, 6);
    if (width == 0 || height == 0)
      ERREXIT(cinfo, JERR_GIF_EMPTY);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (sinfo->max_pixels &&
        (unsigned long long)width * height > sinfo->max_pixels)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif
    source->is_interlaced = (BitSet(hdrbuf[8], INTERLACE) != 0);

    /* Read local colormap if header indicates it is present */
    /* Note: if we wanted to support skipping images, */
    /* we'd need to skip rather than read colormap for ignored images */
    if (BitSet(hdrbuf[8], COLORMAPFLAG)) {
      colormaplen = 2 << (hdrbuf[8] & 0x07);
      ReadColorMap(source, colormaplen, source->colormap);
    }

    source->input_code_size = ReadByte(source); /* get min-code-size byte */
    if (source->input_code_size < 2 || source->input_code_size > 8)
      ERREXIT1(cinfo, JERR_GIF_CODESIZE, source->input_code_size);

    /* Reached desired image, so break out of loop */
    /* If we wanted to skip this image, */
    /* we'd call SkipDataBlocks and then continue the loop */
    break;
  }

  /* Prepare to read selected image: first initialize LZW decompressor */
  source->symbol_head = (UINT16 *)
    (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                LZW_TABLE_SIZE * sizeof(UINT16));
  source->symbol_tail = (UINT8 *)
    (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                LZW_TABLE_SIZE * sizeof(UINT8));
  source->symbol_stack = (UINT8 *)
    (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                LZW_TABLE_SIZE * sizeof(UINT8));
  InitLZWCode(source);

  /*
   * If image is interlaced, we read it into a full-size sample array,
   * decompressing as we go; then get_interlaced_row selects rows from the
   * sample array in the proper order.
   */
  if (source->is_interlaced) {
    /* We request the virtual array now, but can't access it until virtual
     * arrays have been allocated.  Hence, the actual work of reading the
     * image is postponed until the first call to get_pixel_rows.
     */
    source->interlaced_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       (JDIMENSION)width, (JDIMENSION)height, (JDIMENSION)1);
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
    source->pub.get_pixel_rows = load_interlaced_image;
  } else {
    source->pub.get_pixel_rows = get_pixel_rows;
  }

  /* Create compressor input buffer. */
  source->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)width * NUMCOLORS,
     (JDIMENSION)1);
  source->pub.buffer_height = 1;

  /* Pad colormap for safety. */
  for (c = colormaplen; c < source->clear_code; c++) {
    source->colormap[CM_RED][c]   =
    source->colormap[CM_GREEN][c] =
    source->colormap[CM_BLUE][c]  = CENTERJSAMPLE;
  }

  /* Return info about the image. */
  cinfo->in_color_space = JCS_RGB;
  cinfo->input_components = NUMCOLORS;
  cinfo->data_precision = BITS_IN_JSAMPLE; /* we always rescale data to this */
  cinfo->image_width = width;
  cinfo->image_height = height;

  TRACEMS3(cinfo, 1, JTRC_GIF, width, height, colormaplen);
}